

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void duckdb::roaring::SetInvalidRange(ValidityMask *result,idx_t start,idx_t end)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unsigned_long *puVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  idx_t iVar6;
  InternalException *this_00;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  string local_58;
  idx_t local_38;
  
  if (end < start || end - start == 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"SetInvalidRange called with end (%d) <= start (%d)","");
    InternalException::InternalException<unsigned_long,unsigned_long>(this_00,&local_58,end,start);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((result->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    local_38 = (result->super_TemplatedValidityMask<unsigned_long>).capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_58,&local_38);
    sVar4 = local_58._M_string_length;
    _Var3._M_p = local_58._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    this = (result->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    (result->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)_Var3._M_p;
    (result->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
    }
    pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(result->super_TemplatedValidityMask<unsigned_long>).validity_data);
    (result->super_TemplatedValidityMask<unsigned_long>).validity_mask =
         (unsigned_long *)
         (pTVar5->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>;
  }
  puVar2 = (result->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar7 = start & 0x3f;
  iVar6 = start;
  if (uVar7 != 0) {
    uVar1 = (0x40 - uVar7) + start;
    uVar8 = *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar7 * 8);
    lVar9 = 0x40 - uVar7;
    if (end < uVar1) {
      lVar9 = 0;
      if (end <= uVar1) {
        lVar9 = uVar1 - end;
      }
      uVar8 = uVar8 | (&ValidityUncompressed::UPPER_MASKS)[lVar9];
      lVar9 = end - start;
    }
    iVar6 = lVar9 + start;
    puVar2[start >> 6] = puVar2[start >> 6] & uVar8;
  }
  uVar7 = end - iVar6;
  if (0x3f < uVar7) {
    switchD_0105dc25::default(puVar2 + (iVar6 >> 6),0,((uVar7 >> 6) + (ulong)(uVar7 >> 6 == 0)) * 8)
    ;
  }
  if ((uVar7 & 0x3f) != 0) {
    puVar2[end >> 6] =
         puVar2[end >> 6] & (&ValidityUncompressed::UPPER_MASKS)[0x40 - ((uint)end & 0x3f)];
  }
  return;
}

Assistant:

void SetInvalidRange(ValidityMask &result, idx_t start, idx_t end) {
	if (end <= start) {
		throw InternalException("SetInvalidRange called with end (%d) <= start (%d)", end, start);
	}
	result.EnsureWritable();
	auto result_data = (validity_t *)result.GetData();

#ifdef DEBUG
	ValidityMask copy_for_verification(result.Capacity());
	copy_for_verification.EnsureWritable();
	for (idx_t i = 0;
	     i < AlignValue<idx_t, ValidityMask::BITS_PER_VALUE>(result.Capacity()) / ValidityMask::BITS_PER_VALUE; i++) {
		copy_for_verification.GetData()[i] = result.GetData()[i];
	}
#endif
	idx_t index = start;

	if ((index % ValidityMask::BITS_PER_VALUE) != 0) {
		// Adjust the high bits of the first entry

		// +======================================+
		// |xxxxxxxxxxxxxxxxxxxxxxxxx|            |
		// +======================================+
		//
		// 'x': bits to set to 0 in the result

		idx_t right_bits = index % ValidityMask::BITS_PER_VALUE;
		idx_t bits_to_set = ValidityMask::BITS_PER_VALUE - right_bits;
		idx_t left_bits = 0;
		if (index + bits_to_set > end) {
			// Limit the amount of bits to set
			left_bits = (index + bits_to_set) - end;
			bits_to_set = end - index;
		}

		// Prepare the mask
		validity_t mask = ValidityUncompressed::LOWER_MASKS[right_bits];
		if (left_bits) {
			// Mask off the part that we don't want to touch (if the range doesn't fully cover the bits)
			mask |= ValidityUncompressed::UPPER_MASKS[left_bits];
		}

		idx_t entry_idx = index / ValidityMask::BITS_PER_VALUE;
		index += bits_to_set;
		result_data[entry_idx] &= mask;
	}

	idx_t remaining_bits = end - index;
	idx_t full_entries = remaining_bits / ValidityMask::BITS_PER_VALUE;
	idx_t entry_idx = index / ValidityMask::BITS_PER_VALUE;
	// Set all the entries that are fully covered by the range to 0
	for (idx_t i = 0; i < full_entries; i++) {
		result_data[entry_idx + i] = (validity_t)0;
	}

	if ((remaining_bits % ValidityMask::BITS_PER_VALUE) != 0) {
		// The last entry touched by the range is only partially covered

		// +======================================+
		// |                         |xxxxxxxxxxxx|
		// +======================================+
		//
		// 'x': bits to set to 0 in the result

		idx_t bits_to_set = end % ValidityMask::BITS_PER_VALUE;
		idx_t left_bits = ValidityMask::BITS_PER_VALUE - bits_to_set;
		validity_t mask = ValidityUncompressed::UPPER_MASKS[left_bits];
		idx_t entry_idx = end / ValidityMask::BITS_PER_VALUE;
		result_data[entry_idx] &= mask;
	}

#ifdef DEBUG
	D_ASSERT(end <= result.Capacity());
	for (idx_t i = 0; i < result.Capacity(); i++) {
		if (i >= start && i < end) {
			D_ASSERT(!result.RowIsValidUnsafe(i));
		} else {
			// Ensure no others bits are touched by this method
			D_ASSERT(copy_for_verification.RowIsValidUnsafe(i) == result.RowIsValidUnsafe(i));
		}
	}
#endif
}